

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

CBlock * CreateGenesisBlock(CBlock *__return_storage_ptr__,uint32_t nTime,uint32_t nNonce,
                           uint32_t nBits,int32_t nVersion,CAmount *genesisReward)

{
  CScript *this;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  CScript genesisOutputScript;
  CAmount *in_stack_ffffffffffffff70;
  undefined1 local_78 [40];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = 0;
  local_78._24_8_ = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  util::hex_literals::
  operator___hex_v_u8<util::hex_literals::detail::Hex<131UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  this = CScript::operator<<((CScript *)local_78,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &stack0xffffffffffffff70);
  other = &CScript::operator<<(this,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_50,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff70
            );
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
  CreateGenesisBlock(__return_storage_ptr__,
                     "The Times 03/Jan/2009 Chancellor on brink of second bailout for banks",
                     (CScript *)&local_50,nTime,nNonce,nBits,nVersion,in_stack_ffffffffffffff70);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CBlock CreateGenesisBlock(uint32_t nTime, uint32_t nNonce, uint32_t nBits, int32_t nVersion, const CAmount& genesisReward)
{
    const char* pszTimestamp = "The Times 03/Jan/2009 Chancellor on brink of second bailout for banks";
    const CScript genesisOutputScript = CScript() << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38c4f35504e51ec112de5c384df7ba0b8d578a4c702b6bf11d5f"_hex_v_u8 << OP_CHECKSIG;
    return CreateGenesisBlock(pszTimestamp, genesisOutputScript, nTime, nNonce, nBits, nVersion, genesisReward);
}